

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int instadisintegrate(char *str)

{
  int iVar1;
  int local_24;
  uint local_20;
  int local_1c;
  int result;
  char *str_local;
  
  if (((((u.uprops[4].intrinsic == 0) && (u.uprops[4].extrinsic == 0)) &&
       ((youmonst.mintrinsics & 8) == 0)) ||
      ((((u.uprops[4].intrinsic & 0x4000000) != 0 && ((u.uprops[4].intrinsic & 0xfbffffff) == 0)) &&
       ((u.uprops[4].extrinsic == 0 && ((youmonst.mintrinsics & 8) == 0)))))) &&
     (((((u.uprops[4].intrinsic & 0x4000000) == 0 || ((u.uprops[4].intrinsic & 0xfbffffff) != 0)) ||
       ((u.uprops[4].extrinsic != 0 ||
        (((youmonst.mintrinsics & 8) != 0 || (iVar1 = rn2(10), iVar1 == 0)))))) &&
      (iVar1 = rn2(10), iVar1 != 0)))) {
    pline("You disintegrate!");
    if ((youmonst.data)->cwt < 0x65) {
      local_20 = 1;
    }
    else {
      local_20 = (youmonst.data)->cwt / 100;
    }
    local_1c = rnd(local_20);
    if (6 < local_1c) {
      local_1c = 6;
    }
    if (local_1c < 7) {
      local_24 = local_1c;
    }
    else {
      local_24 = 6;
    }
    killer_format = 1;
    u.ugrave_arise = -3;
    killer = str;
    done(0xb);
    return local_24;
  }
  return 0;
}

Assistant:

int instadisintegrate(const char *str)
{
	int result;
	if (FDisint_resistance || (PDisint_resistance && rn2(10)) || !rn2(10))
	    return 0;
	pline("You disintegrate!");
	result = youmonst.data->cwt;
	weight_dmg(result);
	result = min(6, result);
	killer_format = KILLED_BY;
	killer = str;
	u.ugrave_arise = -3;
	done(DISINTEGRATED);

	return result;
}